

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_TreeCollider.cpp
# Opt level: O2

bool __thiscall
Opcode::AABBTreeCollider::Collide
          (AABBTreeCollider *this,BVTCache *cache,Matrix4x4 *world0,Matrix4x4 *world1)

{
  uint uVar1;
  Model *pMVar2;
  Model *pMVar3;
  MeshInterface *pMVar4;
  MeshInterface *pMVar5;
  AABBQuantizedNoLeafTree *tree0;
  AABBQuantizedNoLeafTree *tree1;
  uint uVar6;
  uint uVar7;
  
  pMVar2 = cache->Model0;
  if ((pMVar2 != (Model *)0x0) && (pMVar3 = cache->Model1, pMVar3 != (Model *)0x0)) {
    uVar6 = (pMVar2->super_BaseModel).mModelCode;
    uVar7 = uVar6 >> 1 & 1;
    uVar1 = (pMVar3->super_BaseModel).mModelCode;
    if ((uVar7 == ((uVar1 >> 1 & 1) != 0)) && (uVar6 = uVar6 & 1, uVar6 == (uVar1 & 1))) {
      pMVar4 = (pMVar2->super_BaseModel).mIMesh;
      pMVar5 = (pMVar3->super_BaseModel).mIMesh;
      this->mIMesh0 = pMVar4;
      this->mIMesh1 = pMVar5;
      if (pMVar5 != (MeshInterface *)0x0 && pMVar4 != (MeshInterface *)0x0) {
        tree0 = (AABBQuantizedNoLeafTree *)(pMVar2->super_BaseModel).mTree;
        tree1 = (AABBQuantizedNoLeafTree *)(pMVar3->super_BaseModel).mTree;
        if (uVar7 == 0) {
          if (uVar6 == 0) {
            Collide(this,(AABBCollisionTree *)tree0,(AABBCollisionTree *)tree1,world0,world1,
                    &cache->super_Pair);
          }
          else {
            Collide(this,(AABBQuantizedTree *)tree0,(AABBQuantizedTree *)tree1,world0,world1,
                    &cache->super_Pair);
          }
        }
        else if (uVar6 == 0) {
          Collide(this,(AABBNoLeafTree *)tree0,(AABBNoLeafTree *)tree1,world0,world1,
                  &cache->super_Pair);
        }
        else {
          Collide(this,tree0,tree1,world0,world1,&cache->super_Pair);
        }
        return true;
      }
    }
    return false;
  }
  return false;
}

Assistant:

bool AABBTreeCollider::Collide(BVTCache& cache, const Matrix4x4* world0, const Matrix4x4* world1)
{
	// Checkings
	if(!cache.Model0 || !cache.Model1)								return false;
	if(cache.Model0->HasLeafNodes()!=cache.Model1->HasLeafNodes())	return false;
	if(cache.Model0->IsQuantized()!=cache.Model1->IsQuantized())	return false;

	/*
	
	  Rules:
		- perform hull test
		- when hulls collide, disable hull test
		- if meshes overlap, reset countdown
		- if countdown reaches 0, enable hull test

	*/

#ifdef __MESHMERIZER_H__
	// Handle hulls
	if(cache.HullTest)
	{
		if(cache.Model0->GetHull() && cache.Model1->GetHull())
		{
			struct Local
			{
				static Point* SVCallback(const Point& sv, udword& previndex, udword user_data)
				{
					CollisionHull* Hull = (CollisionHull*)user_data;
					previndex = Hull->ComputeSupportingVertex(sv, previndex);
					return (Point*)&Hull->GetVerts()[previndex];
				}
			};

			bool Collide;

			if(0)
			{
				static GJKEngine GJK;
				static bool GJKInitDone=false;
				if(!GJKInitDone)
				{
					GJK.Enable(GJK_BACKUP_PROCEDURE);
					GJK.Enable(GJK_DEGENERATE);
					GJK.Enable(GJK_HILLCLIMBING);
					GJKInitDone = true;
				}
				GJK.SetCallbackObj0(Local::SVCallback);
				GJK.SetCallbackObj1(Local::SVCallback);
				GJK.SetUserData0(udword(cache.Model0->GetHull()));
				GJK.SetUserData1(udword(cache.Model1->GetHull()));
				Collide = GJK.Collide(*world0, *world1, &cache.SepVector);
			}
			else
			{
				static SVEngine SVE;
				SVE.SetCallbackObj0(Local::SVCallback);
				SVE.SetCallbackObj1(Local::SVCallback);
				SVE.SetUserData0(udword(cache.Model0->GetHull()));
				SVE.SetUserData1(udword(cache.Model1->GetHull()));
				Collide = SVE.Collide(*world0, *world1, &cache.SepVector);
			}

			if(!Collide)
			{
		// Reset stats & contact status
		mFlags &= ~OPC_CONTACT;
		mNbBVBVTests		= 0;
		mNbPrimPrimTests	= 0;
		mNbBVPrimTests		= 0;
		mPairs.Reset();
		return true;
			}
		}
	}

	// Here, hulls collide
	cache.HullTest = false;
#endif // __MESHMERIZER_H__

	// Checkings
	if(!Setup(cache.Model0->GetMeshInterface(), cache.Model1->GetMeshInterface()))	return false;

	// Simple double-dispatch
	bool Status;
	if(!cache.Model0->HasLeafNodes())
	{
		if(cache.Model0->IsQuantized())
		{
			const AABBQuantizedNoLeafTree* T0 = (const AABBQuantizedNoLeafTree*)cache.Model0->GetTree();
			const AABBQuantizedNoLeafTree* T1 = (const AABBQuantizedNoLeafTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
		else
		{
			const AABBNoLeafTree* T0 = (const AABBNoLeafTree*)cache.Model0->GetTree();
			const AABBNoLeafTree* T1 = (const AABBNoLeafTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
	}
	else
	{
		if(cache.Model0->IsQuantized())
		{
			const AABBQuantizedTree* T0 = (const AABBQuantizedTree*)cache.Model0->GetTree();
			const AABBQuantizedTree* T1 = (const AABBQuantizedTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
		else
		{
			const AABBCollisionTree* T0 = (const AABBCollisionTree*)cache.Model0->GetTree();
			const AABBCollisionTree* T1 = (const AABBCollisionTree*)cache.Model1->GetTree();
			Status = Collide(T0, T1, world0, world1, &cache);
		}
	}

#ifdef __MESHMERIZER_H__
	if(Status)
	{
		// Reset counter as long as overlap occurs
		if(GetContactStatus())	cache.ResetCountDown();

		// Enable hull test again when counter reaches zero
		cache.CountDown--;
		if(!cache.CountDown)
		{
			cache.ResetCountDown();
			cache.HullTest = true;
		}
	}
#endif
	return Status;
}